

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToEquivClassCP
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<unsigned_int> *result,
          codepoint_t baseOffset)

{
  CharSetNode *pCVar1;
  int iVar2;
  CharSet<char16_t> *this_00;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint i;
  uint index;
  int j;
  long lVar7;
  codepoint_t local_68 [2];
  codepoint_t equivs [4];
  uint local_4c;
  CharSet<char16_t> *pCStack_48;
  uint acth;
  ulong local_40;
  uint local_34 [2];
  uint tblidx;
  
  local_40 = (ulong)baseOffset;
  local_34[0] = 0;
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    uVar3 = local_40;
    index = 0;
    pCStack_48 = this;
    while( true ) {
      this_00 = pCStack_48;
      uVar5 = GetCompactLength(pCStack_48);
      if (uVar5 <= index) break;
      uVar5 = GetCompactCharU(this_00,index);
      iVar2 = (int)uVar3;
      uVar6 = GetCompactCharU(this_00,index);
      bVar4 = CaseInsensitive::RangeToEquivClass
                        (local_34,uVar5 + iVar2,uVar6 + iVar2,&local_4c,local_68);
      if (bVar4) {
        for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
          CharSet<unsigned_int>::Set(result,allocator,local_68[lVar7]);
        }
      }
      else {
        uVar5 = GetCompactCharU(pCStack_48,index);
        CharSet<unsigned_int>::Set(result,allocator,(uVar5 & 0xffff) + iVar2);
      }
      index = index + 1;
    }
  }
  else {
    CharBitvec::ToEquivClass<unsigned_int>
              (&(this->rep).full.direct,allocator,0,local_34,result,baseOffset);
    pCVar1 = (this->rep).full.root;
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[8])(pCVar1,allocator,2,0,local_34,result,(int)local_40);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToEquivClassCP(ArenaAllocator* allocator, CharSet<codepoint_t>& result, codepoint_t baseOffset)
    {
        uint tblidx = 0;
        if (IsCompact())
        {
            Sort();
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                uint acth;
                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                if (CaseInsensitive::RangeToEquivClass(tblidx, this->GetCompactCharU(i) + baseOffset, this->GetCompactCharU(i) + baseOffset, acth, equivs))
                {
                    for (int j = 0; j < CaseInsensitive::EquivClassSize; j++)
                    {
                        result.Set(allocator, equivs[j]);
                    }
                }
                else
                {
                    result.Set(allocator, this->GetCompactChar(i) + baseOffset);
                }
            }
        }
        else
        {
            rep.full.direct.ToEquivClass<codepoint_t>(allocator, 0, tblidx, result, baseOffset);
            if (rep.full.root != nullptr)
            {
                rep.full.root->ToEquivClassCP(allocator, CharSetNode::levels - 1, 0, tblidx, result, baseOffset);
            }
        }
    }